

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree_navigator.h
# Opt level: O3

CordRep * __thiscall absl::cord_internal::CordRepBtreeNavigator::NextUp(CordRepBtreeNavigator *this)

{
  bool bVar1;
  long lVar2;
  CordRepBtree *pCVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  ulong uVar7;
  
  if ((ulong)(this->node_[0]->super_CordRep).storage[2] - 1 != (ulong)this->index_[0]) {
    __assert_fail("index_[0] == node_[0]->back()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree_navigator.h"
                  ,0xe4,"CordRep *absl::cord_internal::CordRepBtreeNavigator::NextUp()");
  }
  uVar6 = (ulong)(uint)this->height_;
  if (this->height_ < 1) {
    uVar6 = 0;
  }
  uVar7 = 0;
  do {
    if (uVar6 == uVar7) {
      return (CordRep *)0x0;
    }
    lVar2 = uVar7 + 1;
    pCVar3 = this->node_[uVar7 + 1];
    uVar4 = (ulong)(this->index_ + 1)[uVar7] + 1;
    uVar7 = lVar2;
  } while (uVar4 == (pCVar3->super_CordRep).storage[2]);
  this->index_[lVar2] = (uint8_t)uVar4;
  bVar5 = (pCVar3->super_CordRep).storage[1];
  lVar2 = (long)(int)lVar2;
  do {
    if (uVar4 < bVar5) {
      __assert_fail("index >= begin()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                    ,0x268,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
    }
    if ((pCVar3->super_CordRep).storage[2] <= uVar4) goto LAB_00174689;
    pCVar3 = (CordRepBtree *)pCVar3->edges_[uVar4];
    if ((pCVar3->super_CordRep).tag != '\x03') {
      __assert_fail("IsBtree()",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                    ,599,"CordRepBtree *absl::cord_internal::CordRep::btree()");
    }
    this->node_[lVar2 + -1] = pCVar3;
    bVar5 = (pCVar3->super_CordRep).storage[1];
    uVar4 = (ulong)bVar5;
    this->index_[lVar2 + -1] = bVar5;
    bVar1 = 1 < lVar2;
    lVar2 = lVar2 + -1;
  } while (bVar1);
  if (bVar5 < (pCVar3->super_CordRep).storage[2]) {
    return pCVar3->edges_[uVar4];
  }
LAB_00174689:
  __assert_fail("index < end()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]osqp-cpp/build_O3/_deps/abseil-cpp-src/absl/strings/internal/cord_rep_btree.h"
                ,0x269,"CordRep *absl::cord_internal::CordRepBtree::Edge(size_t) const");
}

Assistant:

inline CordRep* CordRepBtreeNavigator::NextUp() {
  assert(index_[0] == node_[0]->back());
  CordRepBtree* edge;
  size_t index;
  int height = 0;
  do {
    if (++height > height_) return nullptr;
    edge = node_[height];
    index = index_[height] + 1;
  } while (index == edge->end());
  index_[height] = static_cast<uint8_t>(index);
  do {
    node_[--height] = edge = edge->Edge(index)->btree();
    index_[height] = static_cast<uint8_t>(index = edge->begin());
  } while (height > 0);
  return edge->Edge(index);
}